

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# av1_inv_txfm_avx2.c
# Opt level: O0

void lowbd_inv_txfm2d_add_no_identity_avx2
               (int32_t *input,uint8_t *output,int stride,TX_TYPE tx_type,TX_SIZE tx_size,int eob)

{
  undefined1 auVar1 [16];
  undefined1 auVar2 [32];
  __m256i alVar3;
  undefined1 auVar4 [32];
  undefined1 auVar5 [32];
  undefined8 uVar6;
  uint uVar7;
  __m256i *palVar8;
  byte in_CL;
  long lVar9;
  byte in_R8B;
  int in_R9D;
  undefined1 auVar10 [32];
  int i_2;
  int j_3;
  __m256i *buf1_cur_1;
  int i_1;
  __m256i scale1;
  int j_2;
  int offset;
  __m256i temp [16];
  int j_1;
  __m256i *buf1_cur;
  int j;
  __m256i buf0 [64];
  int i;
  __m256i scale0;
  int lr_flip;
  int ud_flip;
  transform_1d_avx2 col_txfm;
  transform_1d_avx2 row_txfm;
  int fun_idx_y;
  int fun_idx_x;
  int rect_type;
  int input_stride;
  int buf_size_nonzero_h_div16;
  int buf_size_nonzero_w;
  int buf_size_w_div16;
  int txfm_size_row;
  int txfm_size_col;
  int txh_idx;
  int txw_idx;
  int8_t *shift;
  int eoby;
  int eobx;
  __m256i buf1 [1024];
  undefined4 in_stack_ffffffffffff7368;
  undefined4 in_stack_ffffffffffff736c;
  int iVar11;
  __m256i *in_stack_ffffffffffff7370;
  int in_stack_ffffffffffff7378;
  undefined4 in_stack_ffffffffffff737c;
  int iVar12;
  undefined8 in_stack_ffffffffffff7398;
  undefined8 uVar13;
  __m256i *in_stack_ffffffffffff73a0;
  __m256i *in_stack_ffffffffffff73a8;
  int local_8c48;
  longlong local_8c40 [51];
  __m256i *in_stack_ffffffffffff7558;
  __m256i *in_stack_ffffffffffff7560;
  int local_8a34;
  int local_8a24;
  longlong local_8a20 [259];
  int local_8204;
  undefined1 local_8200 [16];
  undefined1 auStack_81f0 [16];
  int local_81d8;
  int local_81d4;
  transform_1d_avx2 local_81d0;
  transform_1d_avx2 local_81c8;
  int local_81bc;
  int local_81b8;
  int local_81b4;
  int local_81b0;
  int local_81ac;
  int local_81a8;
  int local_81a4;
  int local_81a0;
  int local_819c;
  int local_8198;
  int local_8194;
  char *local_8190;
  int local_8188;
  int local_8184;
  longlong local_8180 [4100];
  byte local_15e;
  byte local_15d;
  ushort local_144;
  ushort local_142;
  undefined1 local_140 [16];
  undefined8 uStack_130;
  undefined8 uStack_128;
  longlong local_120;
  longlong lStack_118;
  longlong lStack_110;
  longlong lStack_108;
  undefined1 local_100 [16];
  undefined1 auStack_f0 [16];
  longlong local_e0;
  longlong lStack_d8;
  longlong lStack_d0;
  longlong lStack_c8;
  undefined1 local_c0 [32];
  ushort local_a0;
  ushort local_9e;
  ushort local_9c;
  ushort local_9a;
  ushort local_98;
  ushort local_96;
  ushort local_94;
  ushort local_92;
  ushort local_90;
  ushort local_8e;
  ushort local_8c;
  ushort local_8a;
  ushort local_88;
  ushort local_86;
  ushort local_84;
  ushort local_82;
  undefined1 local_80 [32];
  ushort local_50;
  ushort local_4e;
  ushort local_4c;
  ushort local_4a;
  ushort local_48;
  ushort local_46;
  ushort local_44;
  ushort local_42;
  ushort local_40;
  ushort local_3e;
  ushort local_3c;
  ushort local_3a;
  ushort local_38;
  ushort local_36;
  ushort local_34;
  ushort local_32;
  
  local_15e = in_R8B;
  local_15d = in_CL;
  get_eobx_eoby_scan_default(&local_8184,&local_8188,in_R8B,in_R9D);
  local_8190 = av1_inv_txfm_shift_ls[local_15e];
  local_8194 = get_txw_idx(local_15e);
  local_8198 = get_txh_idx(local_15e);
  local_819c = tx_size_wide[local_15e];
  local_81a0 = tx_size_high[local_15e];
  local_81a4 = local_819c >> 4;
  local_81a8 = (local_8184 + 0x10 >> 4) << 4;
  local_81ac = local_8188 + 0x10 >> 4;
  iVar12 = local_81a0;
  if (0x20 < local_81a0) {
    iVar12 = 0x20;
  }
  local_81b0 = iVar12;
  local_81b4 = get_rect_tx_log_ratio(local_819c,local_81a0);
  local_81b8 = lowbd_txfm_all_1d_zeros_idx[local_8184];
  local_81bc = lowbd_txfm_all_1d_zeros_idx[local_8188];
  local_81c8 = lowbd_txfm_all_1d_zeros_w16_arr[local_8194][""[local_15d]][local_81b8];
  local_81d0 = lowbd_txfm_all_1d_zeros_w16_arr[local_8198][""[local_15d]][local_81bc];
  get_flip_cfg(local_15d,&local_81d4,&local_81d8);
  uVar7 = 1 << (*local_8190 + 0xfU & 0x1f);
  local_142 = (ushort)uVar7;
  auVar1 = vpinsrw_avx(ZEXT216(local_142),uVar7 & 0xffff,1);
  auVar1 = vpinsrw_avx(auVar1,uVar7 & 0xffff,2);
  auVar1 = vpinsrw_avx(auVar1,uVar7 & 0xffff,3);
  auVar1 = vpinsrw_avx(auVar1,uVar7 & 0xffff,4);
  auVar1 = vpinsrw_avx(auVar1,uVar7 & 0xffff,5);
  auVar1 = vpinsrw_avx(auVar1,uVar7 & 0xffff,6);
  auVar1 = vpinsrw_avx(auVar1,uVar7 & 0xffff,7);
  auVar10._0_16_ = vpinsrw_avx(ZEXT216(local_142),uVar7 & 0xffff,1);
  auVar10._0_16_ = vpinsrw_avx(auVar10._0_16_,uVar7 & 0xffff,2);
  auVar10._0_16_ = vpinsrw_avx(auVar10._0_16_,uVar7 & 0xffff,3);
  auVar10._0_16_ = vpinsrw_avx(auVar10._0_16_,uVar7 & 0xffff,4);
  auVar10._0_16_ = vpinsrw_avx(auVar10._0_16_,uVar7 & 0xffff,5);
  auVar10._0_16_ = vpinsrw_avx(auVar10._0_16_,uVar7 & 0xffff,6);
  auVar10._0_16_ = vpinsrw_avx(auVar10._0_16_,uVar7 & 0xffff,7);
  local_c0._0_16_ = ZEXT116(0) * auVar1 + ZEXT116(1) * auVar10._0_16_;
  local_c0._16_16_ = ZEXT116(0) * SUB4816((undefined1  [48])0x0,0) + ZEXT116(1) * auVar1;
  local_a0 = local_142;
  local_9e = local_142;
  local_9c = local_142;
  local_9a = local_142;
  local_98 = local_142;
  local_96 = local_142;
  local_94 = local_142;
  local_92 = local_142;
  local_90 = local_142;
  local_8e = local_142;
  local_8c = local_142;
  local_8a = local_142;
  local_88 = local_142;
  local_86 = local_142;
  local_84 = local_142;
  local_82 = local_142;
  local_8200 = local_c0._0_16_;
  auStack_81f0 = local_c0._16_16_;
  for (local_8204 = 0; local_8204 < local_81ac; local_8204 = local_8204 + 1) {
    load_buffer_32bit_to_16bit_w16_avx2
              ((int32_t *)CONCAT44(in_stack_ffffffffffff737c,in_stack_ffffffffffff7378),
               (int)((ulong)in_stack_ffffffffffff7370 >> 0x20),
               (__m256i *)CONCAT44(in_stack_ffffffffffff736c,in_stack_ffffffffffff7368),iVar12);
    if ((local_81b4 == 1) || (local_81b4 == -1)) {
      round_shift_avx2(in_stack_ffffffffffff73a8,in_stack_ffffffffffff73a0,
                       (int)((ulong)in_stack_ffffffffffff7398 >> 0x20));
    }
    (*local_81c8)((__m256i *)local_8a20,(__m256i *)local_8a20);
    local_8a24 = 0;
    while( true ) {
      auVar10._0_16_ = auStack_81f0;
      auVar1 = local_8200;
      auStack_81f0._8_8_ = auVar10._8_8_;
      auStack_81f0._0_8_ = auVar10._0_8_;
      local_8200 = auVar1;
      auStack_81f0 = auVar10._0_16_;
      if (local_819c <= local_8a24) break;
      lVar9 = (long)local_8a24;
      local_e0 = local_8a20[lVar9 * 4];
      lStack_d8 = local_8a20[lVar9 * 4 + 1];
      lStack_d0 = local_8a20[lVar9 * 4 + 2];
      lStack_c8 = local_8a20[lVar9 * 4 + 3];
      auVar5._8_8_ = lStack_d8;
      auVar5._0_8_ = local_e0;
      auVar5._16_8_ = lStack_d0;
      auVar5._24_8_ = lStack_c8;
      auVar2._16_8_ = auStack_81f0._0_8_;
      auVar2._0_16_ = auVar1;
      auVar2._24_8_ = auStack_81f0._8_8_;
      auVar2 = vpmulhrsw_avx2(auVar5,auVar2);
      *(undefined1 (*) [32])(local_8a20 + (long)local_8a24 * 4) = auVar2;
      local_8a24 = local_8a24 + 1;
      local_100 = auVar1;
      auStack_f0 = auVar10._0_16_;
    }
    if (local_81d8 == 0) {
      for (local_8c48 = 0; local_8c48 < local_81a4; local_8c48 = local_8c48 + 1) {
        transpose_16bit_16x16_avx2(in_stack_ffffffffffff7560,in_stack_ffffffffffff7558);
      }
    }
    else {
      for (local_8a34 = 0; local_8a34 < local_81a4; local_8a34 = local_8a34 + 1) {
        flip_buf_avx2((__m256i *)(local_8a20 + (long)(local_8a34 << 4) * 4),(__m256i *)local_8c40,
                      0x10);
        transpose_16bit_16x16_avx2(in_stack_ffffffffffff7560,in_stack_ffffffffffff7558);
      }
    }
  }
  uVar7 = 1 << (local_8190[1] + 0xfU & 0x1f);
  local_144 = (ushort)uVar7;
  auVar1 = vpinsrw_avx(ZEXT216(local_144),uVar7 & 0xffff,1);
  auVar1 = vpinsrw_avx(auVar1,uVar7 & 0xffff,2);
  auVar1 = vpinsrw_avx(auVar1,uVar7 & 0xffff,3);
  auVar1 = vpinsrw_avx(auVar1,uVar7 & 0xffff,4);
  auVar1 = vpinsrw_avx(auVar1,uVar7 & 0xffff,5);
  auVar1 = vpinsrw_avx(auVar1,uVar7 & 0xffff,6);
  auVar1 = vpinsrw_avx(auVar1,uVar7 & 0xffff,7);
  auVar10._0_16_ = vpinsrw_avx(ZEXT216(local_144),uVar7 & 0xffff,1);
  auVar10._0_16_ = vpinsrw_avx(auVar10._0_16_,uVar7 & 0xffff,2);
  auVar10._0_16_ = vpinsrw_avx(auVar10._0_16_,uVar7 & 0xffff,3);
  auVar10._0_16_ = vpinsrw_avx(auVar10._0_16_,uVar7 & 0xffff,4);
  auVar10._0_16_ = vpinsrw_avx(auVar10._0_16_,uVar7 & 0xffff,5);
  auVar10._0_16_ = vpinsrw_avx(auVar10._0_16_,uVar7 & 0xffff,6);
  auVar10._0_16_ = vpinsrw_avx(auVar10._0_16_,uVar7 & 0xffff,7);
  auVar10._0_16_ = ZEXT116(0) * auVar1 + ZEXT116(1) * auVar10._0_16_;
  auVar10._16_16_ = ZEXT116(0) * SUB4816((undefined1  [48])0x0,0) + ZEXT116(1) * auVar1;
  local_80._16_8_ = auVar10._16_8_;
  uVar6 = local_80._16_8_;
  local_80._24_8_ = auVar10._24_8_;
  uVar13 = local_80._24_8_;
  local_80 = auVar10;
  local_50 = local_144;
  local_4e = local_144;
  local_4c = local_144;
  local_4a = local_144;
  local_48 = local_144;
  local_46 = local_144;
  local_44 = local_144;
  local_42 = local_144;
  local_40 = local_144;
  local_3e = local_144;
  local_3c = local_144;
  local_3a = local_144;
  local_38 = local_144;
  local_36 = local_144;
  local_34 = local_144;
  local_32 = local_144;
  for (iVar12 = 0; iVar12 < local_81a4; iVar12 = iVar12 + 1) {
    in_stack_ffffffffffff7370 = (__m256i *)(local_8180 + (long)(iVar12 * local_81a0) * 4);
    (*local_81d0)(in_stack_ffffffffffff7370,in_stack_ffffffffffff7370);
    for (iVar11 = 0; iVar11 < local_81a0; iVar11 = iVar11 + 1) {
      palVar8 = in_stack_ffffffffffff7370 + iVar11;
      local_120 = (*palVar8)[0];
      lStack_118 = (*palVar8)[1];
      lStack_110 = (*palVar8)[2];
      lStack_108 = (*palVar8)[3];
      uStack_130 = uVar6;
      auVar4._16_8_ = uVar6;
      auVar4._0_16_ = auVar10._0_16_;
      auVar4._24_8_ = uVar13;
      alVar3 = (__m256i)vpmulhrsw_avx2((undefined1  [32])*palVar8,auVar4);
      in_stack_ffffffffffff7370[iVar11] = alVar3;
      uStack_128 = uVar13;
      local_140 = auVar10._0_16_;
    }
  }
  iVar11 = 0;
  while( true ) {
    if (local_81a4 <= iVar11) break;
    lowbd_write_buffer_16xn_avx2
              (auVar10._8_8_,auVar10._0_8_,iVar12,in_stack_ffffffffffff7378,
               (int)((ulong)in_stack_ffffffffffff7370 >> 0x20));
    iVar11 = iVar11 + 1;
  }
  return;
}

Assistant:

static inline void lowbd_inv_txfm2d_add_no_identity_avx2(
    const int32_t *input, uint8_t *output, int stride, TX_TYPE tx_type,
    TX_SIZE tx_size, int eob) {
  __m256i buf1[64 * 16];
  int eobx, eoby;
  get_eobx_eoby_scan_default(&eobx, &eoby, tx_size, eob);
  const int8_t *shift = av1_inv_txfm_shift_ls[tx_size];
  const int txw_idx = get_txw_idx(tx_size);
  const int txh_idx = get_txh_idx(tx_size);
  const int txfm_size_col = tx_size_wide[tx_size];
  const int txfm_size_row = tx_size_high[tx_size];
  const int buf_size_w_div16 = txfm_size_col >> 4;
  const int buf_size_nonzero_w = ((eobx + 16) >> 4) << 4;
  const int buf_size_nonzero_h_div16 = (eoby + 16) >> 4;
  const int input_stride = AOMMIN(32, txfm_size_row);
  const int rect_type = get_rect_tx_log_ratio(txfm_size_col, txfm_size_row);

  const int fun_idx_x = lowbd_txfm_all_1d_zeros_idx[eobx];
  const int fun_idx_y = lowbd_txfm_all_1d_zeros_idx[eoby];
  const transform_1d_avx2 row_txfm =
      lowbd_txfm_all_1d_zeros_w16_arr[txw_idx][hitx_1d_tab[tx_type]][fun_idx_x];
  const transform_1d_avx2 col_txfm =
      lowbd_txfm_all_1d_zeros_w16_arr[txh_idx][vitx_1d_tab[tx_type]][fun_idx_y];

  assert(col_txfm != NULL);
  assert(row_txfm != NULL);
  int ud_flip, lr_flip;
  get_flip_cfg(tx_type, &ud_flip, &lr_flip);
  const __m256i scale0 = _mm256_set1_epi16(1 << (15 + shift[0]));
  for (int i = 0; i < buf_size_nonzero_h_div16; i++) {
    __m256i buf0[64];
    load_buffer_32bit_to_16bit_w16_avx2(input + 16 * i, input_stride, buf0,
                                        buf_size_nonzero_w);
    if (rect_type == 1 || rect_type == -1) {
      round_shift_avx2(buf0, buf0, buf_size_nonzero_w);  // rect special code
    }
    row_txfm(buf0, buf0);
    for (int j = 0; j < txfm_size_col; ++j) {
      buf0[j] = _mm256_mulhrs_epi16(buf0[j], scale0);
    }

    __m256i *buf1_cur = buf1 + (i << 4);
    if (lr_flip) {
      for (int j = 0; j < buf_size_w_div16; ++j) {
        __m256i temp[16];
        flip_buf_avx2(buf0 + 16 * j, temp, 16);
        int offset = txfm_size_row * (buf_size_w_div16 - 1 - j);
        transpose_16bit_16x16_avx2(temp, buf1_cur + offset);
      }
    } else {
      for (int j = 0; j < buf_size_w_div16; ++j) {
        transpose_16bit_16x16_avx2(buf0 + 16 * j, buf1_cur + txfm_size_row * j);
      }
    }
  }
  const __m256i scale1 = _mm256_set1_epi16(1 << (15 + shift[1]));
  for (int i = 0; i < buf_size_w_div16; i++) {
    __m256i *buf1_cur = buf1 + i * txfm_size_row;
    col_txfm(buf1_cur, buf1_cur);
    for (int j = 0; j < txfm_size_row; ++j) {
      buf1_cur[j] = _mm256_mulhrs_epi16(buf1_cur[j], scale1);
    }
  }
  for (int i = 0; i < buf_size_w_div16; i++) {
    lowbd_write_buffer_16xn_avx2(buf1 + i * txfm_size_row, output + 16 * i,
                                 stride, ud_flip, txfm_size_row);
  }
}